

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RenameExprUnmap(Parse *pParse,Expr *pExpr)

{
  undefined1 local_50 [8];
  Walker sWalker;
  u8 eMode;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  sWalker.u._7_1_ = pParse->eParseMode;
  memset(local_50,0,0x30);
  sWalker.pParse = (Parse *)renameUnmapExprCb;
  sWalker.xExprCallback = renameUnmapSelectCb;
  pParse->eParseMode = '\x03';
  local_50 = (undefined1  [8])pParse;
  sqlite3WalkExpr((Walker *)local_50,pExpr);
  pParse->eParseMode = sWalker.u._7_1_;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprUnmap(Parse *pParse, Expr *pExpr){
  u8 eMode = pParse->eParseMode;
  Walker sWalker;
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = pParse;
  sWalker.xExprCallback = renameUnmapExprCb;
  sWalker.xSelectCallback = renameUnmapSelectCb;
  pParse->eParseMode = PARSE_MODE_UNMAP;
  sqlite3WalkExpr(&sWalker, pExpr);
  pParse->eParseMode = eMode;
}